

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2926b4::initiatorFixture::startLoggedOn(initiatorFixture *this)

{
  UtcTimeStamp *pUVar1;
  UtcTimeStamp *val;
  Logon local_5e0;
  undefined1 local_488 [8];
  Message receivedLogon;
  Logon local_320;
  Message local_1c8 [8];
  Message sentLogon;
  UtcTimeOnly local_70;
  UtcTimeOnly local_58;
  UtcTimeStamp local_40;
  UtcTimeStamp local_28;
  initiatorFixture *local_10;
  initiatorFixture *this_local;
  
  local_10 = this;
  FIX::UtcTimeStamp::now();
  pUVar1 = &(this->super_sessionFixture).super_TestCallback.now;
  FIX::UtcTimeStamp::operator=(pUVar1,&local_28);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_28);
  val = &(this->super_sessionFixture).super_TestCallback.startTimeStamp;
  FIX::UtcTimeStamp::operator=(val,pUVar1);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_40,0x10,0x10,0x10,0xd,5,0x898);
  pUVar1 = &(this->super_sessionFixture).super_TestCallback.endTimeStamp;
  FIX::UtcTimeStamp::operator=(pUVar1,&local_40);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_40);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_58,&val->super_DateTime);
  FIX::UtcTimeOnly::operator=(&(this->super_sessionFixture).super_TestCallback.startTime,&local_58);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_58);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_70,&pUVar1->super_DateTime);
  FIX::UtcTimeOnly::operator=(&(this->super_sessionFixture).super_TestCallback.endTime,&local_70);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_70);
  (*(this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder[8])
            (this,1,0,0x1f);
  createLogon(&local_320,"TW","ISLD",1);
  FIX::Message::Message(local_1c8,(Message *)&local_320);
  FIX42::Logon::~Logon(&local_320);
  FIX::Session::send((Message *)(this->super_sessionFixture).object);
  FIX::Session::next((UtcTimeStamp *)(this->super_sessionFixture).object);
  FIX::Session::logon((this->super_sessionFixture).object);
  createLogon(&local_5e0,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_488,(Message *)&local_5e0);
  FIX42::Logon::~Logon(&local_5e0);
  FIX::Session::next((Message *)(this->super_sessionFixture).object,(UtcTimeStamp *)local_488,
                     (bool)((char)this + '\x10'));
  FIX::Message::~Message((Message *)local_488);
  FIX::Message::~Message(local_1c8);
  return;
}

Assistant:

void startLoggedOn() {
    now = UtcTimeStamp::now();
    startTimeStamp = now;
    endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);

    createSession(1, 0, 31);

    FIX::Message sentLogon = createLogon("TW", "ISLD", 1);
    object->send(sentLogon);
    object->next(now);
    object->logon();

    FIX::Message receivedLogon = createLogon("ISLD", "TW", 1);
    object->next(receivedLogon, now);
  }